

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
::rehash_and_grow_if_necessary
          (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
           *this)

{
  char *pcVar1;
  byte *pbVar2;
  ulong uVar3;
  ctrl_t *pcVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  undefined8 uVar20;
  ctrl_t *pcVar21;
  size_t hashval;
  size_t i;
  slot_type *old_slot;
  slot_type *old_slot_00;
  slot_type *old_slot_01;
  slot_type *old_slot_02;
  pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  *p;
  ulong uVar22;
  byte bVar23;
  pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  *i_00;
  FindInfo FVar24;
  probe_seq<16UL> pStack_88;
  allocator<int> aaStack_70 [64];
  
  uVar3 = this->capacity_;
  if (uVar3 == 0) {
    resize(this,1);
    return;
  }
  if ((uVar3 + 1 & uVar3) != 0) {
    __assert_fail("IsValidCapacity(capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x248,"size_t phmap::priv::CapacityToGrowth(size_t)");
  }
  if (uVar3 - (uVar3 >> 3) >> 1 < this->size_) {
    resize(this,uVar3 * 2 + 1);
    return;
  }
  uVar3 = this->capacity_;
  if ((uVar3 == 0) || ((uVar3 + 1 & uVar3) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x822,
                  "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::StringPolicy, phmap::priv::(anonymous namespace)::StringHash, phmap::priv::(anonymous namespace)::StringEq, std::allocator<int>>::drop_deletes_without_resize() [Policy = phmap::priv::(anonymous namespace)::StringPolicy, Hash = phmap::priv::(anonymous namespace)::StringHash, Eq = phmap::priv::(anonymous namespace)::StringEq, Alloc = std::allocator<int>]"
                 );
  }
  if (uVar3 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x823,
                  "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::StringPolicy, phmap::priv::(anonymous namespace)::StringHash, phmap::priv::(anonymous namespace)::StringEq, std::allocator<int>>::drop_deletes_without_resize() [Policy = phmap::priv::(anonymous namespace)::StringPolicy, Hash = phmap::priv::(anonymous namespace)::StringHash, Eq = phmap::priv::(anonymous namespace)::StringEq, Alloc = std::allocator<int>]"
                 );
  }
  pcVar4 = this->ctrl_;
  if (pcVar4[uVar3] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x230,
                  "void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *__restrict, size_t)"
                 );
  }
  pcVar21 = pcVar4 + uVar3;
  if (pcVar21 + 1 != pcVar4) {
    uVar22 = 0;
    do {
      pcVar1 = pcVar4 + uVar22;
      cVar5 = pcVar1[1];
      cVar6 = pcVar1[2];
      cVar7 = pcVar1[3];
      cVar8 = pcVar1[4];
      cVar9 = pcVar1[5];
      cVar10 = pcVar1[6];
      cVar11 = pcVar1[7];
      cVar12 = pcVar1[8];
      cVar13 = pcVar1[9];
      cVar14 = pcVar1[10];
      cVar15 = pcVar1[0xb];
      cVar16 = pcVar1[0xc];
      cVar17 = pcVar1[0xd];
      cVar18 = pcVar1[0xe];
      cVar19 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar4 + uVar22);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar5 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar6 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar7 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar8 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar9 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar10 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      uVar22 = uVar22 + 0x10;
    } while (uVar3 + 1 != uVar22);
  }
  uVar20 = *(undefined8 *)(pcVar4 + 8);
  *(undefined8 *)(pcVar21 + 1) = *(undefined8 *)pcVar4;
  *(undefined8 *)(pcVar21 + 9) = uVar20;
  *pcVar21 = -1;
  p = (pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
       *)this->capacity_;
  if (p != (pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
            *)0x0) {
    i_00 = (pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
            *)0x0;
    do {
      if (this->ctrl_
          [(long)&(i_00->first).
                  super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ] == -2) {
        pStack_88.offset_ = (size_t)&this->slots_[(long)i_00].pair.second;
        pStack_88.mask_ = (size_t)(this->slots_ + (long)i_00);
        hashval = (anonymous_namespace)::StringPolicy::
                  apply_impl<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>::HashElement,std::__cxx11::string_const&,std::tuple<std::__cxx11::string_const&>,void>
                            ((HashElement *)&pStack_88,p);
        FVar24 = find_first_non_full(this,hashval);
        i = FVar24.offset;
        probe(&pStack_88,this,hashval);
        uVar22 = i - pStack_88.offset_;
        uVar3 = this->capacity_;
        probe(&pStack_88,this,hashval);
        bVar23 = (byte)hashval;
        if (((long)i_00 - pStack_88.offset_ & this->capacity_ ^ uVar22 & uVar3) < 0x10) {
          bVar23 = bVar23 & 0x7f;
        }
        else {
          if (this->ctrl_[i] == -2) {
            set_ctrl(this,i,bVar23 & 0x7f);
            hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,void>::
            transfer<std::allocator<int>>(aaStack_70,this->slots_ + (long)i_00,old_slot_00);
            hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,void>::
            transfer<std::allocator<int>>
                      ((allocator<int> *)(this->slots_ + (long)i_00),this->slots_ + i,old_slot_01);
            hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,void>::
            transfer<std::allocator<int>>
                      ((allocator<int> *)(this->slots_ + i),(slot_type *)aaStack_70,old_slot_02);
            i_00 = (pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
                    *)((long)&i_00[-1].second.
                              super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              .
                              super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
                              ._M_head_impl + 7);
            goto LAB_001221bc;
          }
          if (this->ctrl_[i] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                          ,0x853,
                          "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::StringPolicy, phmap::priv::(anonymous namespace)::StringHash, phmap::priv::(anonymous namespace)::StringEq, std::allocator<int>>::drop_deletes_without_resize() [Policy = phmap::priv::(anonymous namespace)::StringPolicy, Hash = phmap::priv::(anonymous namespace)::StringHash, Eq = phmap::priv::(anonymous namespace)::StringEq, Alloc = std::allocator<int>]"
                         );
          }
          set_ctrl(this,i,bVar23 & 0x7f);
          hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,void>::
          transfer<std::allocator<int>>
                    ((allocator<int> *)(this->slots_ + i),this->slots_ + (long)i_00,old_slot);
          bVar23 = 0x80;
        }
        set_ctrl(this,(size_t)i_00,bVar23);
      }
LAB_001221bc:
      i_00 = (pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
              *)((long)&(i_00->first).
                        super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        .
                        super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
                        ._M_head_impl + 1);
      p = (pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
           *)this->capacity_;
    } while (i_00 != p);
  }
  reset_growth_left(this,(size_t)p);
  return;
}

Assistant:

void rehash_and_grow_if_necessary() {
        if (capacity_ == 0) {
            resize(1);
        } else if (size() <= CapacityToGrowth(capacity()) / 2) {
            // Squash DELETED without growing if there is enough capacity.
            drop_deletes_without_resize();
        } else {
            // Otherwise grow the container.
            resize(capacity_ * 2 + 1);
        }
    }